

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tinyexr.h
# Opt level: O0

int EXRLayers(char *filename,char ***layer_names,int *num_layers,char **err)

{
  int iVar1;
  size_type sVar2;
  void *pvVar3;
  size_type sVar4;
  char *pcVar5;
  undefined4 *in_RDX;
  long *in_RSI;
  char **in_RDI;
  EXRVersion *unaff_retaddr;
  EXRHeader *in_stack_00000008;
  size_t c;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  layer_vec;
  int ret;
  int ret_1;
  EXRHeader exr_header;
  EXRVersion exr_version;
  EXRHeader *in_stack_fffffffffffffe88;
  string *in_stack_fffffffffffffe90;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *in_stack_fffffffffffffea0;
  EXRVersion *in_stack_fffffffffffffea8;
  size_type local_150;
  pointer in_stack_fffffffffffffec0;
  pointer in_stack_fffffffffffffec8;
  undefined4 in_stack_fffffffffffffed0;
  undefined4 in_stack_fffffffffffffed4;
  string local_128 [48];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *in_stack_ffffffffffffff08;
  EXRHeader *in_stack_ffffffffffffff10;
  int local_30;
  int local_2c;
  undefined4 in_stack_fffffffffffffff8;
  undefined4 in_stack_fffffffffffffffc;
  
  InitEXRHeader((EXRHeader *)0x302084);
  iVar1 = ParseEXRVersionFromFile(in_stack_fffffffffffffea8,(char *)in_stack_fffffffffffffea0);
  if (iVar1 == 0) {
    if ((local_2c == 0) && (local_30 == 0)) {
      iVar1 = ParseEXRHeaderFromFile
                        (in_stack_00000008,unaff_retaddr,
                         (char *)CONCAT44(in_stack_fffffffffffffffc,in_stack_fffffffffffffff8),
                         in_RDI);
      if (iVar1 == 0) {
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)0x302266);
        tinyexr::GetLayers(in_stack_ffffffffffffff10,in_stack_ffffffffffffff08);
        sVar2 = std::
                vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::size((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        *)&stack0xfffffffffffffeb8);
        *in_RDX = (int)sVar2;
        sVar2 = std::
                vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::size((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        *)&stack0xfffffffffffffeb8);
        pvVar3 = malloc(sVar2 << 3);
        *in_RSI = (long)pvVar3;
        local_150 = 0;
        while( true ) {
          sVar2 = local_150;
          sVar4 = std::
                  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ::size((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          *)&stack0xfffffffffffffeb8);
          if (sVar4 <= sVar2) break;
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        *)&stack0xfffffffffffffeb8,local_150);
          pcVar5 = (char *)std::__cxx11::string::c_str();
          pcVar5 = strdup(pcVar5);
          *(char **)(*in_RSI + local_150 * 8) = pcVar5;
          local_150 = local_150 + 1;
        }
        FreeEXRHeader(in_stack_fffffffffffffe88);
        iVar1 = 0;
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~vector(in_stack_fffffffffffffea0);
      }
      else {
        FreeEXRHeader(in_stack_fffffffffffffe88);
      }
    }
    else {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 CONCAT44(in_stack_fffffffffffffed4,in_stack_fffffffffffffed0),
                 (char *)in_stack_fffffffffffffec8,(allocator<char> *)in_stack_fffffffffffffec0);
      tinyexr::SetErrorMessage(in_stack_fffffffffffffe90,(char **)in_stack_fffffffffffffe88);
      std::__cxx11::string::~string(local_128);
      std::allocator<char>::~allocator((allocator<char> *)&stack0xfffffffffffffed7);
      iVar1 = -4;
    }
  }
  else {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               CONCAT44(in_stack_fffffffffffffed4,in_stack_fffffffffffffed0),
               (char *)in_stack_fffffffffffffec8,(allocator<char> *)in_stack_fffffffffffffec0);
    tinyexr::SetErrorMessage(in_stack_fffffffffffffe90,(char **)in_stack_fffffffffffffe88);
    std::__cxx11::string::~string((string *)&stack0xffffffffffffff10);
    std::allocator<char>::~allocator((allocator<char> *)&stack0xffffffffffffff0f);
  }
  return iVar1;
}

Assistant:

int EXRLayers(const char *filename, const char **layer_names[], int *num_layers, const char **err) {
  EXRVersion exr_version;
  EXRHeader exr_header;
  InitEXRHeader(&exr_header);

  {
    int ret = ParseEXRVersionFromFile(&exr_version, filename);
    if (ret != TINYEXR_SUCCESS) {
      tinyexr::SetErrorMessage("Invalid EXR header.", err);
      return ret;
    }

    if (exr_version.multipart || exr_version.non_image) {
      tinyexr::SetErrorMessage(
        "Loading multipart or DeepImage is not supported  in LoadEXR() API",
        err);
      return TINYEXR_ERROR_INVALID_DATA;  // @fixme.
    }
  }

  int ret = ParseEXRHeaderFromFile(&exr_header, &exr_version, filename, err);
  if (ret != TINYEXR_SUCCESS) {
    FreeEXRHeader(&exr_header);
    return ret;
  }

  std::vector<std::string> layer_vec;
  tinyexr::GetLayers(exr_header, layer_vec);

  (*num_layers) = int(layer_vec.size());
  (*layer_names) = static_cast<const char **>(
    malloc(sizeof(const char *) * static_cast<size_t>(layer_vec.size())));
  for (size_t c = 0; c < static_cast<size_t>(layer_vec.size()); c++) {
#ifdef _MSC_VER
    (*layer_names)[c] = _strdup(layer_vec[c].c_str());
#else
    (*layer_names)[c] = strdup(layer_vec[c].c_str());
#endif
  }

  FreeEXRHeader(&exr_header);
  return TINYEXR_SUCCESS;
}